

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::relaxedFmsF64x2
          (Literal *__return_storage_ptr__,Literal *this,Literal *left,Literal *right)

{
  Type *__return_storage_ptr___00;
  long lVar1;
  Literal *this_00;
  undefined1 local_100 [8];
  LaneArray<2> x;
  LaneArray<2> y;
  LaneArray<2> z;
  undefined1 auStack_58 [8];
  LaneArray<2> r;
  
  getLanesF64x2((LaneArray<2> *)local_100,this);
  getLanesF64x2((LaneArray<2> *)&x._M_elems[1].type,left);
  getLanesF64x2((LaneArray<2> *)&y._M_elems[1].type,right);
  r._M_elems[1].field_0.i64 = 0;
  r._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  r._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  r._M_elems[0].type.id = 0;
  auStack_58 = (undefined1  [8])0x0;
  r._M_elems[0].field_0.i64 = 0;
  lVar1 = 0;
  __return_storage_ptr___00 = &z._M_elems[1].type;
  do {
    fms((Literal *)__return_storage_ptr___00,(Literal *)(local_100 + lVar1),
        (Literal *)((long)&x._M_elems[1].type.id + lVar1),
        (Literal *)((long)&y._M_elems[1].type.id + lVar1));
    this_00 = (Literal *)((long)r._M_elems + lVar1 + -8);
    if (this_00 != (Literal *)__return_storage_ptr___00) {
      ~Literal(this_00);
      Literal(this_00,(Literal *)__return_storage_ptr___00);
    }
    ~Literal((Literal *)__return_storage_ptr___00);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 == 0x18);
  Literal(__return_storage_ptr__,(LaneArray<2> *)auStack_58);
  lVar1 = 0x18;
  do {
    ~Literal((Literal *)((long)r._M_elems + lVar1 + -8));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x18;
  do {
    ~Literal((Literal *)((long)&y._M_elems[1].type.id + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x18;
  do {
    ~Literal((Literal *)((long)&x._M_elems[1].type.id + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x18;
  do {
    ~Literal((Literal *)(local_100 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::relaxedFmsF64x2(const Literal& left,
                                 const Literal& right) const {
  return ternary<2, &Literal::getLanesF64x2, &Literal::fms>(*this, left, right);
}